

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O0

Result Kernel::OrderingUtils::
       lexProductCapture<Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__1,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__2,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__3>
                 (anon_class_24_3_676d14a6 ord1,anon_class_24_3_02943ac4 ord2,
                 anon_class_16_2_f9f0633a ords)

{
  anon_class_16_2_f9f0633a ord2_00;
  anon_class_24_3_02943ac4 ord1_00;
  Result RVar1;
  undefined8 in_RSI;
  Result c;
  anon_class_24_3_676d14a6 *in_stack_ffffffffffffffa0;
  Literal **ppLVar2;
  Result local_4;
  
  ppLVar2 = (Literal **)&stack0x00000020;
  RVar1 = QKbo::compare::anon_class_24_3_676d14a6::operator()(in_stack_ffffffffffffffa0);
  if (1 < RVar1 - GREATER) {
    if (RVar1 == EQUAL) {
      ord1_00.l2 = (Literal **)*ppLVar2;
      ord1_00.l1 = (Literal **)in_RSI;
      ord1_00.this = (QKbo *)ppLVar2[1];
      ord2_00.l2 = ppLVar2;
      ord2_00.l1 = (Literal **)in_stack_ffffffffffffffa0;
      RVar1 = lexProductCapture<Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__2,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__3>
                        (ord1_00,ord2_00);
    }
    else if (RVar1 != INCOMPARABLE) {
      RVar1 = local_4;
    }
  }
  local_4 = RVar1;
  return local_4;
}

Assistant:

static Ordering::Result lexProductCapture(Ord1 ord1, Ord2 ord2, Ords... ords)
    { 
      auto c = ord1();
      switch(c) {
        case Ordering::Result::EQUAL: 
          return OrderingUtils::lexProductCapture(ord2,ords...);
        case Ordering::Result::INCOMPARABLE: 
        case Ordering::Result::GREATER: 
        case Ordering::Result::LESS: 
          return c;
        default:;
      }
      ASSERTION_VIOLATION_REP(c)
    }